

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::Base64Data,cfd::js::api::json::HexData,cfd::js::api::Base64DataStruct,cfd::js::api::HexDataStruct>
          (json *this,string *request_message,
          function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)>
          *call_function)

{
  ErrorResponse local_548;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_490 [4];
  JsonClassBase<cfd::js::api::json::HexData> local_470 [4];
  undefined1 local_450 [8];
  HexData res_2;
  undefined1 local_3f0 [8];
  HexDataStruct response;
  Base64DataStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_78 [8];
  Base64Data req;
  function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._80_8_ = call_function;
  Base64Data::Base64Data((Base64Data *)local_78);
  core::JsonClassBase<cfd::js::api::json::Base64Data>::Deserialize
            ((JsonClassBase<cfd::js::api::json::Base64Data> *)local_78,request_message);
  Base64Data::ConvertToStruct
            ((Base64DataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Base64Data *)local_78);
  std::function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)>::operator()
            ((HexDataStruct *)local_3f0,call_function,
             (Base64DataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    HexData::HexData((HexData *)local_450);
    HexData::ConvertFromStruct((HexData *)local_450,(HexDataStruct *)local_3f0);
    core::JsonClassBase<cfd::js::api::json::HexData>::Serialize_abi_cxx11_(local_470);
    std::__cxx11::string::operator=((string *)this,(string *)local_470);
    std::__cxx11::string::~string((string *)local_470);
    HexData::~HexData((HexData *)local_450);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_548,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_490);
    std::__cxx11::string::operator=((string *)this,(string *)local_490);
    std::__cxx11::string::~string((string *)local_490);
    ErrorResponse::~ErrorResponse(&local_548);
  }
  res_2._87_1_ = 1;
  HexDataStruct::~HexDataStruct((HexDataStruct *)local_3f0);
  Base64DataStruct::~Base64DataStruct
            ((Base64DataStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Base64Data::~Base64Data((Base64Data *)local_78);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}